

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.h
# Opt level: O1

void __thiscall
bwtil::HuffmanTree<unsigned_char>::storeTree
          (HuffmanTree<unsigned_char> *this,Node n,
          vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
          *nodes_vec)

{
  Node n_00;
  vector<bool,_std::allocator<bool>_> local_68;
  Node local_38;
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  local_20;
  
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._12_4_ = 0;
  local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_38.node_number = n.node_number;
  local_38._1_7_ = n._1_7_;
  local_38.freq = n.freq;
  local_38.label = n.label;
  local_38.leaf = n.leaf;
  local_38.leaf_left = n.leaf_left;
  local_38.leaf_right = n.leaf_right;
  local_38.left = n.left;
  local_38.right = n.right;
  local_38._22_2_ = n._22_2_;
  std::
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  ::vector(&local_20,nodes_vec);
  n_00.freq = local_38.freq;
  n_00.node_number = local_38.node_number;
  n_00._1_7_ = local_38._1_7_;
  n_00.label = local_38.label;
  n_00.leaf = local_38.leaf;
  n_00.leaf_left = local_38.leaf_left;
  n_00.leaf_right = local_38.leaf_right;
  n_00.left = local_38.left;
  n_00.right = local_38.right;
  n_00._22_2_ = local_38._22_2_;
  storeTree(this,&local_68,n_00,&local_20);
  if (local_20.
      super__Vector_base<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void storeTree(Node n,vector<Node> nodes_vec){

			//root_node = n.node_number;
			storeTree(vector<bool>(),n,nodes_vec);

		}